

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall pbrt::CameraBase::FindMinimumDifferentials(CameraBase *this,CameraHandle *camera)

{
  Vector3f *v;
  Vector3f *v_00;
  float fVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  int *piVar6;
  CameraRayDifferential *p;
  int iVar7;
  Vector3f *v_01;
  undefined1 auVar8 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar9 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar23 [64];
  undefined1 auVar25 [60];
  undefined1 auVar24 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_register_000013c4 [12];
  Vector3<float> VVar30;
  Vector3f VVar31;
  Vector3f VVar32;
  Frame f;
  SampledWavelengths lambda;
  optional<pbrt::CameraRayDifferential> crd;
  Tuple3<pbrt::Vector3,_float> local_168;
  float local_158;
  int local_154;
  Vector3f *local_150;
  Vector3f *local_148;
  Vector3f *local_140;
  Vector3f *local_138;
  CameraHandle *local_130;
  undefined1 local_128 [16];
  CameraSample local_118;
  Frame local_100;
  undefined1 local_d8 [16];
  SampledWavelengths local_c8;
  optional<pbrt::CameraRayDifferential> local_a8;
  undefined1 auVar22 [56];
  
  auVar8._8_4_ = 0x7f800000;
  auVar8._0_8_ = 0x7f8000007f800000;
  auVar8._12_4_ = 0x7f800000;
  local_148 = &this->minDirDifferentialY;
  local_150 = &this->minDirDifferentialX;
  local_138 = &this->minPosDifferentialY;
  local_140 = &this->minPosDifferentialX;
  uVar2 = vmovlps_avx(auVar8);
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  uVar3 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar4 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar3;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar4;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar3;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar4;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar3;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar4;
  local_118.pFilm.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  local_118.pFilm.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  local_118.pLens.super_Tuple2<pbrt::Point2,_float>.x = 0.5;
  local_118.pLens.super_Tuple2<pbrt::Point2,_float>.y = 0.5;
  local_118.time = 0.5;
  local_118.weight = 1.0;
  local_130 = camera;
  SampledWavelengths::SampleXYZ(&local_c8,0.5);
  for (iVar7 = 0; iVar7 != 0x200; iVar7 = iVar7 + 1) {
    piVar6 = (int *)((this->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
                    0xffffffffffff);
    auVar25 = ZEXT1260(in_register_000013c4);
    auVar22 = (undefined1  [56])0x0;
    local_118.pFilm.super_Tuple2<pbrt::Point2,_float>.y = ((float)iVar7 / 511.0) * (float)piVar6[1];
    local_118.pFilm.super_Tuple2<pbrt::Point2,_float>.x = ((float)iVar7 / 511.0) * (float)*piVar6;
    CameraHandle::GenerateRayDifferential(&local_a8,local_130,&local_118,&local_c8);
    if (local_a8.set == true) {
      local_154 = iVar7;
      p = pstd::optional<pbrt::CameraRayDifferential>::value(&local_a8);
      VVar30 = Point3<float>::operator-(&(p->ray).rxOrigin,(Point3<float> *)p);
      local_100.x.super_Tuple3<pbrt::Vector3,_float>.z = VVar30.super_Tuple3<pbrt::Vector3,_float>.z
      ;
      auVar10._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar10._8_56_ = auVar22;
      local_100.x.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar10._0_16_);
      auVar22 = (undefined1  [56])0x0;
      VVar31 = AnimatedTransform::ApplyInverse
                         ((AnimatedTransform *)this,&local_100.x,(p->ray).super_Ray.time);
      auVar23._0_4_ = VVar31.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar23._4_60_ = auVar25;
      auVar11._0_8_ = VVar31.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar11._8_56_ = auVar22;
      fVar1 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar9 = auVar11._0_16_;
      auVar26._0_4_ =
           VVar31.super_Tuple3<pbrt::Vector3,_float>.x * VVar31.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar26._4_4_ =
           VVar31.super_Tuple3<pbrt::Vector3,_float>.y * VVar31.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar26._8_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar26._12_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar8 = vmovshdup_avx(auVar26);
      auVar8 = vfmadd231ss_fma(auVar8,auVar9,auVar9);
      auVar8 = vfmadd231ss_fma(auVar8,auVar23._0_16_,auVar23._0_16_);
      auVar26 = ZEXT416((uint)(this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar26,auVar26);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      auVar27 = ZEXT416((uint)(this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar26 = vfmadd213ss_fma(auVar27,auVar27,auVar26);
      auVar26 = vsqrtss_avx(auVar26,auVar26);
      if (auVar8._0_4_ < auVar26._0_4_) {
        uVar2 = vmovlps_avx(auVar9);
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar2 >> 0x20);
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = auVar23._0_4_;
      }
      VVar30 = Point3<float>::operator-(&(p->ray).ryOrigin,(Point3<float> *)p);
      auVar25 = auVar23._4_60_;
      local_100.x.super_Tuple3<pbrt::Vector3,_float>.z = VVar30.super_Tuple3<pbrt::Vector3,_float>.z
      ;
      auVar12._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar22;
      local_100.x.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar12._0_16_);
      auVar22 = (undefined1  [56])0x0;
      VVar31 = AnimatedTransform::ApplyInverse
                         ((AnimatedTransform *)this,&local_100.x,(p->ray).super_Ray.time);
      auVar24._0_4_ = VVar31.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar24._4_60_ = auVar25;
      auVar13._0_8_ = VVar31.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar22;
      fVar1 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar9 = auVar13._0_16_;
      auVar27._0_4_ =
           VVar31.super_Tuple3<pbrt::Vector3,_float>.x * VVar31.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar27._4_4_ =
           VVar31.super_Tuple3<pbrt::Vector3,_float>.y * VVar31.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar27._8_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar27._12_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar8 = vmovshdup_avx(auVar27);
      auVar8 = vfmadd231ss_fma(auVar8,auVar9,auVar9);
      auVar8 = vfmadd231ss_fma(auVar8,auVar24._0_16_,auVar24._0_16_);
      auVar26 = ZEXT416((uint)(this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar26,auVar26);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      auVar27 = ZEXT416((uint)(this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar26 = vfmadd213ss_fma(auVar27,auVar27,auVar26);
      auVar26 = vsqrtss_avx(auVar26,auVar26);
      if (auVar8._0_4_ < auVar26._0_4_) {
        uVar2 = vmovlps_avx(auVar9);
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar2 >> 0x20);
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = auVar24._0_4_;
      }
      v = &(p->ray).super_Ray.d;
      VVar30 = Normalize<float>(v);
      auVar14._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar14._8_56_ = auVar22;
      v_00 = &(p->ray).rxDirection;
      uVar2 = vmovlps_avx(auVar14._0_16_);
      (p->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
      (p->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20)
      ;
      (p->ray).super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
           VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
      VVar30 = Normalize<float>(v_00);
      auVar15._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar15._8_56_ = auVar22;
      v_01 = &(p->ray).ryDirection;
      uVar2 = vmovlps_avx(auVar15._0_16_);
      (p->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
      (p->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20)
      ;
      (p->ray).rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
           VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
      VVar30 = Normalize<float>(v_01);
      auVar16._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar16._8_56_ = auVar22;
      uVar2 = vmovlps_avx(auVar16._0_16_);
      (p->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
      (p->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20)
      ;
      (p->ray).ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
           VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
      Frame::FromZ(&local_100,v);
      VVar31 = Frame::ToLocal(&local_100,v);
      auVar17._0_8_ = VVar31.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar22;
      local_128 = auVar17._0_16_;
      VVar32 = Frame::ToLocal(&local_100,v_00);
      local_168.z = VVar32.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18._0_8_ = VVar32.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar22;
      local_168._0_8_ = vmovlps_avx(auVar18._0_16_);
      VVar30 = Normalize<float>((Vector3<float> *)&local_168);
      local_158 = VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar19._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar19._8_56_ = auVar22;
      local_d8 = auVar19._0_16_;
      VVar32 = Frame::ToLocal(&local_100,v_01);
      local_168.z = VVar32.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar20._0_8_ = VVar32.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar20._8_56_ = auVar22;
      local_168._0_8_ = vmovlps_avx(auVar20._0_16_);
      VVar30 = Normalize<float>((Vector3<float> *)&local_168);
      auVar21._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar21._8_56_ = auVar22;
      fVar1 = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar9 = vsubps_avx(local_d8,local_128);
      fVar5 = local_158 - VVar31.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar29._0_4_ = auVar9._0_4_ * auVar9._0_4_;
      auVar29._4_4_ = auVar9._4_4_ * auVar9._4_4_;
      auVar29._8_4_ = auVar9._8_4_ * auVar9._8_4_;
      auVar29._12_4_ = auVar9._12_4_ * auVar9._12_4_;
      auVar8 = ZEXT416((uint)(this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar8,auVar8);
      auVar8 = vmovshdup_avx(auVar29);
      auVar8 = vfmadd231ss_fma(auVar8,auVar9,auVar9);
      auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
      auVar27 = ZEXT416((uint)(this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar26 = vfmadd213ss_fma(auVar27,auVar27,auVar26);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      auVar26 = vsqrtss_avx(auVar26,auVar26);
      if (auVar8._0_4_ < auVar26._0_4_) {
        uVar2 = vmovlps_avx(auVar9);
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar2 >> 0x20);
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = fVar5;
      }
      fVar1 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar9 = vsubps_avx(auVar21._0_16_,local_128);
      fVar5 = VVar30.super_Tuple3<pbrt::Vector3,_float>.z -
              VVar31.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar28._0_4_ = auVar9._0_4_ * auVar9._0_4_;
      auVar28._4_4_ = auVar9._4_4_ * auVar9._4_4_;
      auVar28._8_4_ = auVar9._8_4_ * auVar9._8_4_;
      auVar28._12_4_ = auVar9._12_4_ * auVar9._12_4_;
      auVar8 = ZEXT416((uint)(this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),auVar8,auVar8);
      auVar8 = vmovshdup_avx(auVar28);
      auVar8 = vfmadd231ss_fma(auVar8,auVar9,auVar9);
      auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
      auVar27 = ZEXT416((uint)(this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar26 = vfmadd213ss_fma(auVar27,auVar27,auVar26);
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      auVar26 = vsqrtss_avx(auVar26,auVar26);
      iVar7 = local_154;
      if (auVar8._0_4_ < auVar26._0_4_) {
        uVar2 = vmovlps_avx(auVar9);
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar2 >> 0x20);
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = fVar5;
      }
    }
    pstd::optional<pbrt::CameraRayDifferential>::~optional(&local_a8);
  }
  if ((LOGGING_LogLevel < 1) &&
     (Log<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
                (Verbose,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
                 ,0xde,"Camera min pos differentials: %s, %s",local_140,local_138),
     LOGGING_LogLevel < 1)) {
    Log<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
              (Verbose,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
               ,0xe0,"Camera min dir differentials: %s, %s",local_150,local_148);
  }
  return;
}

Assistant:

void CameraBase::FindMinimumDifferentials(CameraHandle camera) {
    minPosDifferentialX = minPosDifferentialY = minDirDifferentialX =
        minDirDifferentialY = Vector3f(Infinity, Infinity, Infinity);

    CameraSample sample;
    sample.pLens = Point2f(0.5, 0.5);
    sample.time = 0.5;
    SampledWavelengths lambda = SampledWavelengths::SampleXYZ(0.5);

    int n = 512;
    for (int i = 0; i < n; ++i) {
        sample.pFilm.x = Float(i) / (n - 1) * film.FullResolution().x;
        sample.pFilm.y = Float(i) / (n - 1) * film.FullResolution().y;

        pstd::optional<CameraRayDifferential> crd =
            camera.GenerateRayDifferential(sample, lambda);
        if (!crd)
            continue;

        RayDifferential &ray = crd->ray;
        Vector3f dox = CameraFromRender(ray.rxOrigin - ray.o, ray.time);
        if (Length(dox) < Length(minPosDifferentialX))
            minPosDifferentialX = dox;
        Vector3f doy = CameraFromRender(ray.ryOrigin - ray.o, ray.time);
        if (Length(doy) < Length(minPosDifferentialY))
            minPosDifferentialY = doy;

        ray.d = Normalize(ray.d);
        ray.rxDirection = Normalize(ray.rxDirection);
        ray.ryDirection = Normalize(ray.ryDirection);

        Frame f = Frame::FromZ(ray.d);
        Vector3f df = f.ToLocal(ray.d);  // should be (0, 0, 1);
        Vector3f dxf = Normalize(f.ToLocal(ray.rxDirection));
        Vector3f dyf = Normalize(f.ToLocal(ray.ryDirection));

        if (Length(dxf - df) < Length(minDirDifferentialX))
            minDirDifferentialX = dxf - df;
        if (Length(dyf - df) < Length(minDirDifferentialY))
            minDirDifferentialY = dyf - df;
    }

    LOG_VERBOSE("Camera min pos differentials: %s, %s", minPosDifferentialX,
                minPosDifferentialY);
    LOG_VERBOSE("Camera min dir differentials: %s, %s", minDirDifferentialX,
                minDirDifferentialY);
}